

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# create_object_visitor.hpp
# Opt level: O0

bool __thiscall
msgpack::v2::detail::create_object_visitor::visit_str
          (create_object_visitor *this,char *v,uint32_t size)

{
  bool bVar1;
  size_t sVar2;
  str_size_overflow *this_00;
  reference ppoVar3;
  object *__dest;
  uint in_EDX;
  object *in_RSI;
  create_object_visitor *in_RDI;
  char *tmp;
  object *obj;
  char *in_stack_ffffffffffffffa8;
  vector<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_> *in_stack_ffffffffffffffb0;
  value_type align;
  size_t in_stack_ffffffffffffffd8;
  zone *in_stack_ffffffffffffffe0;
  
  sVar2 = v1::unpack_limit::str(&in_RDI->m_limit);
  if (in_EDX <= sVar2) {
    ppoVar3 = std::vector<msgpack::v2::object_*,_std::allocator<msgpack::v2::object_*>_>::back
                        (in_stack_ffffffffffffffb0);
    align = *ppoVar3;
    (align->super_object).type = STR;
    if ((in_RDI->m_func == (unpack_reference_func)0x0) ||
       (bVar1 = (*in_RDI->m_func)((align->super_object).type,(size_t)in_EDX,in_RDI->m_user_data),
       !bVar1)) {
      if (in_RSI == (object *)0x0) {
        (align->super_object).via.array.ptr = (object *)0x0;
        (align->super_object).via.array.size = 0;
      }
      else {
        zone(in_RDI);
        __dest = (object *)
                 v1::zone::allocate_align
                           (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,(size_t)align);
        memcpy(__dest,in_RSI,(ulong)in_EDX);
        (align->super_object).via.array.ptr = __dest;
        (align->super_object).via.array.size = in_EDX;
      }
    }
    else {
      (align->super_object).via.array.ptr = in_RSI;
      (align->super_object).via.array.size = in_EDX;
      set_referenced(in_RDI,true);
    }
    return true;
  }
  this_00 = (str_size_overflow *)__cxa_allocate_exception(0x10);
  v1::str_size_overflow::str_size_overflow(this_00,in_stack_ffffffffffffffa8);
  __cxa_throw(this_00,&v1::str_size_overflow::typeinfo,v1::str_size_overflow::~str_size_overflow);
}

Assistant:

bool visit_str(const char* v, uint32_t size) {
        MSGPACK_ASSERT(v || size == 0);
        if (size > m_limit.str()) throw msgpack::str_size_overflow("str size overflow");
        msgpack::object* obj = m_stack.back();
        obj->type = msgpack::type::STR;
        if (m_func && m_func(obj->type, size, m_user_data)) {
            obj->via.str.ptr = v;
            obj->via.str.size = size;
            set_referenced(true);
        }
        else {
            if (v) {
                char* tmp = static_cast<char*>(zone().allocate_align(size, MSGPACK_ZONE_ALIGNOF(char)));
                std::memcpy(tmp, v, size);
                obj->via.str.ptr = tmp;
                obj->via.str.size = size;
            }
            else {
                obj->via.str.ptr = MSGPACK_NULLPTR;
                obj->via.str.size = 0;
            }
        }
        return true;
    }